

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

bool __thiscall
duckdb::Node::MergeNormalNodes
          (Node *this,ART *art,Node *l_node,Node *r_node,uint8_t *byte,GateStatus status)

{
  bool bVar1;
  unsafe_optional_ptr<Node> other;
  unsafe_optional_ptr<Node> this_00;
  int iVar2;
  
  other = GetNextChildInternal<duckdb::Node_const>(art,r_node,byte);
  do {
    if (other.ptr == (Node *)0x0) goto LAB_00c21eb6;
    this_00 = GetChildInternal<duckdb::Node_const>(art,l_node,*byte);
    if (this_00.ptr == (Node *)0x0) {
      InsertChild(art,l_node,*byte,(Node)((other.ptr)->super_IndexPointer).data);
      ReplaceChild(r_node,art,*byte,(Node)0x0);
LAB_00c21e83:
      if (*byte == 0xff) {
        iVar2 = 3;
      }
      else {
        *byte = *byte + '\x01';
        other = GetNextChildInternal<duckdb::Node_const>(art,r_node,byte);
        iVar2 = 0;
      }
    }
    else {
      bVar1 = MergeInternal(this_00.ptr,art,other.ptr,status);
      iVar2 = 1;
      if (bVar1) goto LAB_00c21e83;
    }
  } while (iVar2 == 0);
  if (iVar2 == 3) {
LAB_00c21eb6:
    Free(art,r_node);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Node::MergeNormalNodes(ART &art, Node &l_node, Node &r_node, uint8_t &byte, const GateStatus status) {
	// Merge N4, N16, N48, N256 nodes.
	D_ASSERT(l_node.IsNode() && r_node.IsNode());
	D_ASSERT(l_node.GetGateStatus() == r_node.GetGateStatus());

	auto r_child = r_node.GetNextChildMutable(art, byte);
	while (r_child) {
		auto l_child = l_node.GetChildMutable(art, byte);
		if (!l_child) {
			Node::InsertChild(art, l_node, byte, *r_child);
			r_node.ReplaceChild(art, byte);
		} else {
			if (!l_child->MergeInternal(art, *r_child, status)) {
				return false;
			}
		}

		if (byte == NumericLimits<uint8_t>::Maximum()) {
			break;
		}
		byte++;
		r_child = r_node.GetNextChildMutable(art, byte);
	}

	Node::Free(art, r_node);
	return true;
}